

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

Module * __thiscall wabt::Script::GetModule(Script *this,Var *var)

{
  pointer puVar1;
  Index IVar2;
  ModuleCommand *pMVar3;
  Module *pMVar4;
  
  IVar2 = BindingHash::FindIndex(&this->module_bindings,var);
  puVar1 = (this->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)IVar2 <
      (ulong)((long)(this->commands).
                    super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    pMVar3 = cast<wabt::ModuleCommand,wabt::Command>
                       ((Command *)
                        puVar1[IVar2]._M_t.
                        super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>);
    pMVar4 = &pMVar3->module;
  }
  else {
    pMVar4 = (Module *)0x0;
  }
  return pMVar4;
}

Assistant:

const Module* Script::GetModule(const Var& var) const {
  Index index = module_bindings.FindIndex(var);
  if (index >= commands.size()) {
    return nullptr;
  }
  auto* command = cast<ModuleCommand>(commands[index].get());
  return &command->module;
}